

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TGAImage.cpp
# Opt level: O0

bool __thiscall TRM::TGAImage::scale(TGAImage *this,int w,int h)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uchar *puVar4;
  int local_5c;
  int local_58;
  int i;
  int ox;
  int nx;
  int errx;
  int j;
  unsigned_long olinebytes;
  unsigned_long nlinebytes;
  int local_30;
  int erry;
  int oscanline;
  int nscanline;
  uchar *tdata;
  int h_local;
  int w_local;
  TGAImage *this_local;
  
  if (((w < 1) || (h < 1)) || (this->data == (uchar *)0x0)) {
    this_local._7_1_ = false;
  }
  else {
    puVar4 = (uchar *)operator_new__((long)(w * h * this->bytespp));
    erry = 0;
    local_30 = 0;
    nlinebytes._4_4_ = 0;
    iVar3 = w * this->bytespp;
    iVar1 = this->width;
    iVar2 = this->bytespp;
    for (nx = 0; nx < this->height; nx = nx + 1) {
      ox = this->width - w;
      i = -this->bytespp;
      local_58 = -this->bytespp;
      for (local_5c = 0; local_5c < this->width; local_5c = local_5c + 1) {
        local_58 = this->bytespp + local_58;
        ox = w + ox;
        while (this->width <= ox) {
          ox = ox - this->width;
          i = this->bytespp + i;
          memcpy(puVar4 + (long)i + (long)erry,this->data + (long)local_58 + (long)local_30,
                 (long)this->bytespp);
        }
      }
      local_30 = local_30 + iVar1 * iVar2;
      for (nlinebytes._4_4_ = h + nlinebytes._4_4_; this->height <= nlinebytes._4_4_;
          nlinebytes._4_4_ = nlinebytes._4_4_ - this->height) {
        if (SBORROW4(nlinebytes._4_4_,this->height * 2) == nlinebytes._4_4_ + this->height * -2 < 0)
        {
          memcpy(puVar4 + (long)iVar3 + (long)erry,puVar4 + erry,(long)iVar3);
        }
        erry = erry + iVar3;
      }
    }
    if (this->data != (uchar *)0x0) {
      operator_delete__(this->data);
    }
    this->data = puVar4;
    this->width = w;
    this->height = h;
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool TGAImage::scale(int w, int h) {
  if (w <= 0 || h <= 0 || !data) return false;
  unsigned char *tdata = new unsigned char[w * h * bytespp];
  int nscanline = 0;
  int oscanline = 0;
  int erry = 0;
  unsigned long nlinebytes = w * bytespp;
  unsigned long olinebytes = width * bytespp;
  for (int j = 0; j < height; j++) {
    int errx = width - w;
    int nx = -bytespp;
    int ox = -bytespp;
    for (int i = 0; i < width; i++) {
      ox += bytespp;
      errx += w;
      while (errx >= (int)width) {
        errx -= width;
        nx += bytespp;
        memcpy(tdata + nscanline + nx, data + oscanline + ox, bytespp);
      }
    }
    erry += h;
    oscanline += olinebytes;
    while (erry >= (int)height) {
      if (erry >= (int)height << 1)  // it means we jump over a scanline
        memcpy(tdata + nscanline + nlinebytes, tdata + nscanline, nlinebytes);
      erry -= height;
      nscanline += nlinebytes;
    }
  }
  delete[] data;
  data = tdata;
  width = w;
  height = h;
  return true;
}